

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

MockSpec<int_(int)> * __thiscall
testing::internal::FunctionMocker<int_(int)>::With
          (MockSpec<int_(int)> *__return_storage_ptr__,FunctionMocker<int_(int)> *this,
          Matcher<int> *m)

{
  MatcherBase<int> local_20;
  
  local_20.vtable_ = (m->super_MatcherBase<int>).vtable_;
  local_20.buffer_ = (m->super_MatcherBase<int>).buffer_;
  (m->super_MatcherBase<int>).vtable_ = (VTable *)0x0;
  local_20.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0017f388;
  __return_storage_ptr__->function_mocker_ = this;
  Matcher<int>::Matcher
            ((Matcher<int> *)&__return_storage_ptr__->matchers_,(Matcher<int> *)&local_20);
  MatcherBase<int>::~MatcherBase(&local_20);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }